

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptPromiseResolveThenableTaskFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseResolveThenableTaskFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptPromise *promise,
          RecyclableObject *thenable,RecyclableObject *thenFunction)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  DynamicType *type;
  JavascriptPromiseResolveThenableTaskFunction *this_01;
  undefined1 local_78 [8];
  TrackAllocData data;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_31;
  
  local_78 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x19f3;
  data._32_8_ = thenFunction;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x37a1d4);
  FunctionInfo::FunctionInfo(this_00,entryPoint,ErrorOnNew,0xffffffff,(FunctionProxy *)0x0);
  type = CreateDeferredPrototypeFunctionType(this,entryPoint);
  local_78 = (undefined1  [8])&JavascriptPromiseResolveThenableTaskFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_74a5554;
  data.filename._0_4_ = 0x19f6;
  pRVar1 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_78);
  this_01 = (JavascriptPromiseResolveThenableTaskFunction *)
            new<(Memory::ObjectInfoBits)1>(0x58,pRVar1,&local_31);
  JavascriptPromiseResolveThenableTaskFunction::JavascriptPromiseResolveThenableTaskFunction
            (this_01,type,this_00,promise,thenable,(RecyclableObject *)data._32_8_);
  return this_01;
}

Assistant:

JavascriptPromiseResolveThenableTaskFunction* JavascriptLibrary::CreatePromiseResolveThenableTaskFunction(JavascriptMethod entryPoint, JavascriptPromise* promise, RecyclableObject* thenable, RecyclableObject* thenFunction)
    {
        FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint, FunctionInfo::Attributes::ErrorOnNew);
        DynamicType* type = CreateDeferredPrototypeFunctionType(entryPoint);

        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseResolveThenableTaskFunction, type, functionInfo, promise, thenable, thenFunction);
    }